

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

CompressionFunction * duckdb::FSSTFun::GetFunction(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_FSST;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = FSSTStorage::StringInitAnalyze;
  in_RDI->analyze = FSSTStorage::StringAnalyze;
  in_RDI->final_analyze = FSSTStorage::StringFinalAnalyze;
  in_RDI->init_compression = FSSTStorage::InitCompression;
  in_RDI->compress = FSSTStorage::Compress;
  in_RDI->compress_finalize = FSSTStorage::FinalizeCompress;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = FSSTStorage::StringInitScan;
  in_RDI->scan_vector = FSSTStorage::StringScan;
  in_RDI->scan_partial = FSSTStorage::StringScanPartial<false>;
  in_RDI->select = FSSTStorage::Select;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = FSSTStorage::StringFetchRow;
  in_RDI->skip = UncompressedFunctions::EmptySkip;
  in_RDI->init_segment = UncompressedStringStorage::StringInitSegment;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  in_RDI->get_segment_info = (compression_get_segment_info_t)0x0;
  in_RDI->validity = REQUIRES_VALIDITY;
  return in_RDI;
}

Assistant:

CompressionFunction FSSTFun::GetFunction(PhysicalType data_type) {
	D_ASSERT(data_type == PhysicalType::VARCHAR);
	return CompressionFunction(CompressionType::COMPRESSION_FSST, data_type, FSSTStorage::StringInitAnalyze,
	                           FSSTStorage::StringAnalyze, FSSTStorage::StringFinalAnalyze,
	                           FSSTStorage::InitCompression, FSSTStorage::Compress, FSSTStorage::FinalizeCompress,
	                           FSSTStorage::StringInitScan, FSSTStorage::StringScan,
	                           FSSTStorage::StringScanPartial<false>, FSSTStorage::StringFetchRow,
	                           UncompressedFunctions::EmptySkip, UncompressedStringStorage::StringInitSegment, nullptr,
	                           nullptr, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr, FSSTStorage::Select);
}